

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  long lVar1;
  int iVar2;
  Node *pNVar3;
  Node *pNVar4;
  int n;
  Node *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar3 = this->head_;
  n = (this->max_height_).super___atomic_base<int>._M_i + -1;
  this_00 = pNVar3;
  while ((this_00 == pNVar3 ||
         (iVar2 = MemTable::KeyComparator::operator()(&this->compare_,this_00->key,*key), iVar2 < 0)
         )) {
    pNVar4 = Node::Next(this_00,n);
    if ((pNVar4 == (Node *)0x0) ||
       (iVar2 = MemTable::KeyComparator::operator()(&this->compare_,pNVar4->key,*key), -1 < iVar2))
    {
      if (n == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return this_00;
      }
      n = n + -1;
      pNVar4 = this_00;
    }
    pNVar3 = this->head_;
    this_00 = pNVar4;
  }
  __assert_fail("x == head_ || compare_(x->key, key) < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/skiplist.h"
                ,0x121,
                "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::FindLessThan(const Key &) const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}